

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_sll_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [12];
  undefined1 auVar17 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  
  pfVar1 = (env->active_fpu).fpr + ws;
  sVar3 = *(short *)((long)pfVar1 + 2);
  sVar4 = *(short *)((long)pfVar1 + 4);
  sVar5 = *(short *)((long)pfVar1 + 6);
  sVar6 = *(short *)((long)pfVar1 + 8);
  sVar7 = *(short *)((long)pfVar1 + 10);
  sVar8 = *(short *)((long)pfVar1 + 0xc);
  sVar9 = *(short *)((long)pfVar1 + 0xe);
  auVar10 = (undefined1  [16])(env->active_fpu).fpr[wt] & _DAT_00b902e0;
  auVar15._0_8_ = CONCAT26(auVar10._10_2_,CONCAT24(auVar10._10_2_,(uint)auVar10._8_2_));
  auVar15._8_2_ = auVar10._12_2_;
  auVar15._10_2_ = auVar10._12_2_;
  auVar16._14_2_ = auVar10._14_2_;
  auVar16._12_2_ = auVar16._14_2_;
  auVar16._0_12_ = auVar15;
  auVar17._0_4_ = (int)(short)(int)(float)((uint)auVar10._8_2_ * 0x800000 + 0x3f800000);
  auVar17._4_4_ =
       (int)(short)(int)(float)((int)((ulong)auVar15._0_8_ >> 0x20) * 0x800000 + 0x3f800000);
  auVar17._8_4_ = (int)(short)(int)(float)(auVar15._8_4_ * 0x800000 + 0x3f800000);
  auVar17._12_4_ = (int)(short)(int)(float)(auVar16._12_4_ * 0x800000 + 0x3f800000);
  auVar14._0_12_ = auVar10._0_12_;
  auVar14._12_2_ = auVar10._6_2_;
  auVar14._14_2_ = auVar10._6_2_;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = auVar10._0_10_;
  auVar13._10_2_ = auVar10._4_2_;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = auVar10._0_8_;
  auVar12._8_2_ = auVar10._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = auVar10._2_2_;
  auVar11._0_4_ = auVar10._0_4_;
  auVar11._4_2_ = auVar10._2_2_;
  auVar10._0_4_ = (int)(short)(int)(float)(auVar11._0_4_ * 0x800000 + 0x3f800000);
  auVar10._4_4_ = (int)(short)(int)(float)(auVar11._4_4_ * 0x800000 + 0x3f800000);
  auVar10._8_4_ = (int)(short)(int)(float)(auVar12._8_4_ * 0x800000 + 0x3f800000);
  auVar10._12_4_ = (int)(short)(int)(float)(auVar13._12_4_ * 0x800000 + 0x3f800000);
  auVar10 = packssdw(auVar10,auVar17);
  pfVar2 = (env->active_fpu).fpr + wd;
  *(short *)pfVar2 = auVar10._0_2_ * *(short *)pfVar1;
  *(short *)((long)pfVar2 + 2) = auVar10._2_2_ * sVar3;
  *(short *)((long)pfVar2 + 4) = auVar10._4_2_ * sVar4;
  *(short *)((long)pfVar2 + 6) = auVar10._6_2_ * sVar5;
  *(short *)((long)pfVar2 + 8) = auVar10._8_2_ * sVar6;
  *(short *)((long)pfVar2 + 10) = auVar10._10_2_ * sVar7;
  *(short *)((long)pfVar2 + 0xc) = auVar10._12_2_ * sVar8;
  *(short *)((long)pfVar2 + 0xe) = auVar10._14_2_ * sVar9;
  return;
}

Assistant:

void helper_msa_sll_h(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_sll_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_sll_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_sll_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_sll_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_sll_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_sll_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_sll_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_sll_df(DF_HALF, pws->h[7],  pwt->h[7]);
}